

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-again.c
# Opt level: O0

int run_test_timer_again(void)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_loop_t *loop;
  int r;
  
  uVar2 = uv_default_loop();
  start_time = uv_now(uVar2);
  if (start_time == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,99,"0 < start_time");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&dummy);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x67,"r == 0");
    abort();
  }
  iVar1 = uv_timer_again(&dummy);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x69,"r == UV_EINVAL");
    abort();
  }
  uv_unref(&dummy);
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&repeat_1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x6e,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&repeat_1,repeat_1_cb,0x32,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x70,"r == 0");
    abort();
  }
  lVar3 = uv_timer_get_repeat(&repeat_1);
  if (lVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x71,"uv_timer_get_repeat(&repeat_1) == 0");
    abort();
  }
  uv_timer_set_repeat(&repeat_1,0x32);
  lVar3 = uv_timer_get_repeat(&repeat_1);
  if (lVar3 != 0x32) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x75,"uv_timer_get_repeat(&repeat_1) == 50");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&repeat_2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x7c,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&repeat_2,repeat_2_cb,100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x7e,"r == 0");
    abort();
  }
  lVar3 = uv_timer_get_repeat(&repeat_2);
  if (lVar3 != 100) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x7f,"uv_timer_get_repeat(&repeat_2) == 100");
    abort();
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  __stream = _stderr;
  if (repeat_1_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x83,"repeat_1_cb_called == 10");
    abort();
  }
  if (repeat_2_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x84,"repeat_2_cb_called == 2");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x85,"close_cb_called == 2");
    abort();
  }
  uVar2 = uv_default_loop();
  lVar3 = uv_now(uVar2);
  fprintf(__stream,"Test took %ld ms (expected ~700 ms)\n",lVar3 - start_time);
  fflush(_stderr);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
            ,0x8b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(timer_again) {
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Verify that it is not possible to uv_timer_again a never-started timer. */
  r = uv_timer_init(uv_default_loop(), &dummy);
  ASSERT(r == 0);
  r = uv_timer_again(&dummy);
  ASSERT(r == UV_EINVAL);
  uv_unref((uv_handle_t*)&dummy);

  /* Start timer repeat_1. */
  r = uv_timer_init(uv_default_loop(), &repeat_1);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat_1, repeat_1_cb, 50, 0);
  ASSERT(r == 0);
  ASSERT(uv_timer_get_repeat(&repeat_1) == 0);

  /* Actually make repeat_1 repeating. */
  uv_timer_set_repeat(&repeat_1, 50);
  ASSERT(uv_timer_get_repeat(&repeat_1) == 50);

  /*
   * Start another repeating timer. It'll be again()ed by the repeat_1 so
   * it should not time out until repeat_1 stops.
   */
  r = uv_timer_init(uv_default_loop(), &repeat_2);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat_2, repeat_2_cb, 100, 100);
  ASSERT(r == 0);
  ASSERT(uv_timer_get_repeat(&repeat_2) == 100);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(repeat_1_cb_called == 10);
  ASSERT(repeat_2_cb_called == 2);
  ASSERT(close_cb_called == 2);

  fprintf(stderr, "Test took %ld ms (expected ~700 ms)\n",
          (long int)(uv_now(uv_default_loop()) - start_time));
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}